

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O1

void absl::StrAppend(string *dest,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  pointer pcVar5;
  size_t sVar6;
  size_t __n;
  pointer pcVar7;
  
  sVar1 = (a->piece_)._M_len;
  if ((sVar1 != 0) &&
     ((ulong)((long)(a->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/str_cat.cc"
                  ,0xd2,
                  "void absl::StrAppend(std::string * _Nonnull, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = (b->piece_)._M_len;
  if ((sVar2 != 0) &&
     ((ulong)((long)(b->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/str_cat.cc"
                  ,0xd3,
                  "void absl::StrAppend(std::string * _Nonnull, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar3 = (c->piece_)._M_len;
  if ((sVar3 != 0) &&
     ((ulong)((long)(c->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/str_cat.cc"
                  ,0xd4,
                  "void absl::StrAppend(std::string * _Nonnull, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  uVar4 = dest->_M_string_length;
  std::__cxx11::string::_M_replace_aux((ulong)dest,uVar4,0,(char)sVar2 + (char)sVar1 + (char)sVar3);
  pcVar5 = (dest->_M_dataplus)._M_p;
  pcVar7 = pcVar5 + uVar4;
  sVar6 = (a->piece_)._M_len;
  if (sVar6 != 0) {
    memcpy(pcVar7,(a->piece_)._M_str,sVar6);
  }
  pcVar7 = pcVar7 + sVar6;
  sVar6 = (b->piece_)._M_len;
  if (sVar6 != 0) {
    memcpy(pcVar7,(b->piece_)._M_str,sVar6);
  }
  __n = (c->piece_)._M_len;
  if (__n != 0) {
    memcpy(pcVar7 + sVar6,(c->piece_)._M_str,__n);
  }
  if (pcVar7 + sVar6 + __n == pcVar5 + dest->_M_string_length) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/str_cat.cc"
                ,0xdc,
                "void absl::StrAppend(std::string * _Nonnull, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(std::string* absl_nonnull dest, const AlphaNum& a,
               const AlphaNum& b, const AlphaNum& c) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size() + b.size() + c.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  assert(out == begin + dest->size());
}